

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O1

bool __thiscall
MADPComponentFactoredStates::SetInitialized(MADPComponentFactoredStates *this,bool b)

{
  pointer puVar1;
  pointer puVar2;
  bool bVar3;
  size_t *psVar4;
  FSDist_COF *this_00;
  size_t sVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  ulong uVar7;
  
  if ((int)CONCAT71(in_register_00000031,b) != 0) {
    if (this->_m_initialized != false) {
      return true;
    }
    psVar4 = IndexTools::CalculateStepSize(&this->_m_sfacDomainSizes);
    this->_m_stepSize = psVar4;
    this->_m_nrStates = 1;
    if (this->_m_nrStateFactors != 0) {
      sVar5 = this->_m_nrStates;
      puVar1 = (this->_m_sfacDomainSizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_start;
      puVar2 = (this->_m_sfacDomainSizes).
               super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish;
      uVar6 = 0;
      uVar7 = 1;
      do {
        if ((ulong)((long)puVar2 - (long)puVar1 >> 3) <= uVar6) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
        }
        sVar5 = sVar5 * puVar1[uVar6];
        this->_m_nrStates = sVar5;
        bVar3 = uVar7 < this->_m_nrStateFactors;
        uVar6 = uVar7;
        uVar7 = (ulong)((int)uVar7 + 1);
      } while (bVar3);
    }
    this_00 = (FSDist_COF *)operator_new(0x48);
    FSDist_COF::FSDist_COF(this_00,this);
    this->_m_initialStateDistribution = (FactoredStateDistribution *)this_00;
  }
  this->_m_initialized = b;
  return b;
}

Assistant:

bool MADPComponentFactoredStates::SetInitialized(bool b)
{

    if(b == true)
    {
        if(_m_initialized)
            //already initialized: just return
            return true;

        _m_stepSize = IndexTools::CalculateStepSize(_m_sfacDomainSizes);
        _m_nrStates = 1;
        for(Index i=0;i<_m_nrStateFactors;i++)
            _m_nrStates *= _m_sfacDomainSizes.at(i);



        _m_initialStateDistribution = new FSDist_COF(*this);

#if 0 && DEBUG_MCFS
        PrintDebugStuff();
#endif    

    }
    
    _m_initialized = b;
    return b;
}